

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O3

void __thiscall
iu_MatcherFailure_x_iutest_x_StrNe_Test::Body(iu_MatcherFailure_x_iutest_x_StrNe_Test *this)

{
  TestPartResultReporterInterface *pTVar1;
  TestFlag *pTVar2;
  Variable *pVVar3;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  AssertionResult iutest_ar;
  allocator<char> local_29d;
  TestFlag local_29c;
  string local_298;
  string local_278;
  SPIFailureChecker local_258;
  AssertionResult local_220;
  AssertionResult local_1f8;
  AssertionHelper local_1d0;
  undefined1 local_1a0 [8];
  char (*local_198) [5];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [7];
  ios_base local_120 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_258.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_258.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c1e8;
  local_258.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_29c);
  local_1a0 = (undefined1  [8])&PTR__IMatcher_0023d858;
  local_198 = (char (*) [5])0x206582;
  iutest::detail::StrNeMatcher<char[5]>::operator()
            (&local_1f8,(StrNeMatcher<char[5]> *)local_1a0,(char (*) [5])0x206582);
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::PrintToString<char[5]>(&local_298,(char (*) [5])0x206582);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_278,(detail *)local_298._M_dataplus._M_p,"StrNe(\"hoge\")",(char *)&local_1f8,
               in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_278._M_dataplus._M_p,&local_29d);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x243;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = local_29c.m_test_flags;
  local_190[0]._M_allocated_capacity._0_7_ = 0x203a654e727453;
  local_190[0]._7_4_ = 0x65676f68;
  local_198 = (char (*) [5])0xb;
  local_190[0]._M_local_buf[0xb] = '\0';
  local_1a0 = (undefined1  [8])local_190;
  iutest::detail::SPIFailureChecker::GetResult(&local_220,&local_258,(string *)local_1a0);
  if (local_1a0 != (undefined1  [8])local_190) {
    operator_delete((void *)local_1a0,
                    CONCAT17(local_190[0]._M_local_buf[7],
                             (undefined7)local_190[0]._M_allocated_capacity) + 1);
  }
  local_258.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c268;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_258.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar1 = local_258.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_258.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023c290;
  pVVar3 = iutest::TestEnv::get_vars();
  pVVar3->m_testpartresult_reporter = pTVar1;
  if (local_220.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,local_220.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1d0);
    local_258.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x2052c4;
    local_258.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x100000243;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_258,(Fixed *)local_1a0,false);
    if (local_258.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_258.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_258.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_258.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_message._M_dataplus._M_p != &local_220.m_message.field_2) {
    operator_delete(local_220.m_message._M_dataplus._M_p,
                    local_220.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(MatcherFailure, StrNe)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT("hoge", StrNe("hoge")), "StrNe: hoge");
}